

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementCopying.cpp
# Opt level: O0

void __thiscall TestCopying::testCopyingTextElement(TestCopying *this)

{
  bool bVar1;
  QBrush local_f0 [8];
  QString local_e8;
  TextElement local_d0 [8];
  TextElement elem3;
  QBrush local_b8 [8];
  TextElement local_b0 [8];
  TextElement elem2;
  QBrush local_90 [8];
  QBrush local_88 [8];
  QBrush brush;
  QArrayDataPointer<char16_t> local_70;
  QString local_58;
  TextElement local_40 [8];
  TextElement elem1;
  TestCopying *this_local;
  char16_t *str;
  
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_70,(Data *)0x0,L"foo",3);
  QString::QString(&local_58,&local_70);
  KDReports::TextElement::TextElement(local_40,(QString *)&local_58);
  QString::~QString(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QBrush::QBrush(local_88,7,1);
  KDReports::Element::setBackground((QBrush *)local_40);
  KDReports::Element::background();
  bVar1 = QTest::qCompare<QBrush,QBrush>
                    (local_90,local_88,"elem1.background()","brush",
                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                     ,0x1f);
  QBrush::~QBrush(local_90);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    KDReports::TextElement::TextElement(local_b0,local_40);
    KDReports::Element::background();
    bVar1 = QTest::qCompare<QBrush,QBrush>
                      (local_b8,local_88,"elem2.background()","brush",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                       ,0x21);
    QBrush::~QBrush(local_b8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QString::QString(&local_e8);
      KDReports::TextElement::TextElement(local_d0,(QString *)&local_e8);
      QString::~QString(&local_e8);
      KDReports::TextElement::operator=(local_d0,local_b0);
      KDReports::Element::background();
      QTest::qCompare<QBrush,QBrush>
                (local_f0,local_88,"elem3.background()","brush",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/ElementCopying/ElementCopying.cpp"
                 ,0x24);
      QBrush::~QBrush(local_f0);
      KDReports::TextElement::~TextElement(local_d0);
    }
    KDReports::TextElement::~TextElement(local_b0);
  }
  QBrush::~QBrush(local_88);
  KDReports::TextElement::~TextElement(local_40);
  return;
}

Assistant:

void testCopyingTextElement()
    {
        TextElement elem1(QStringLiteral("foo"));
        QBrush brush(Qt::red);
        elem1.setBackground(brush);
        QCOMPARE(elem1.background(), brush);
        TextElement elem2(elem1); // copy ctor
        QCOMPARE(elem2.background(), brush);
        TextElement elem3;
        elem3 = elem2; // operator=
        QCOMPARE(elem3.background(), brush);
    }